

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall
Lowerer::GenerateStFldWithCachedType
          (Lowerer *this,Instr *instrStFld,bool *continueAsHelperOut,LabelInstr **labelHelperOut,
          RegOpnd **typeOpndOut)

{
  byte bVar1;
  uint uVar2;
  InlineCacheIndex IVar3;
  SymOpnd *this_00;
  ObjTypeSpecFldInfo *pOVar4;
  code *pcVar5;
  LabelInstr **ppLVar6;
  Lowerer *pLVar7;
  bool bVar8;
  OpndKind OVar9;
  bool bVar10;
  BailOutKind BVar11;
  uint sourceContextId;
  uint functionId;
  PropertyId PVar12;
  undefined4 *puVar13;
  PropertySymOpnd *this_01;
  LabelInstr *pLVar14;
  JITTimeFunctionBody *pJVar15;
  FunctionJITTimeInfo *this_02;
  Func *pFVar16;
  LabelInstr *pLVar17;
  BranchInstr *pBVar18;
  JITTypeHolder finalType;
  BailOutInfo *pBVar19;
  JITType *this_03;
  JITTypeHandler *this_04;
  IntConstOpnd *opndArg;
  Instr *pIVar20;
  JITTypeHolderBase<void> local_80;
  LabelInstr **local_78;
  undefined4 local_6c;
  LabelInstr *local_68;
  JITTypeHolder local_60;
  LabelInstr *local_58;
  Func *local_50;
  LabelInstr *local_48;
  Lowerer *local_40;
  LabelInstr *local_38;
  
  local_40 = this;
  if (continueAsHelperOut == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cdb,"(continueAsHelperOut != nullptr)","continueAsHelperOut != nullptr");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  *continueAsHelperOut = false;
  if (labelHelperOut == (LabelInstr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cde,"(labelHelperOut != nullptr)","labelHelperOut != nullptr");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  *labelHelperOut = (LabelInstr *)0x0;
  if (typeOpndOut == (RegOpnd **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce1,"(typeOpndOut != nullptr)","typeOpndOut != nullptr");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  *typeOpndOut = (RegOpnd *)0x0;
  OVar9 = IR::Opnd::GetKind(instrStFld->m_dst);
  if (OVar9 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ce4,"(instrStFld->GetDst()->IsSymOpnd())",
                       "instrStFld->GetDst()->IsSymOpnd()");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  this_00 = (SymOpnd *)instrStFld->m_dst;
  OVar9 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar9 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    local_58 = (LabelInstr *)instrStFld;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
    instrStFld = &local_58->super_Instr;
  }
  bVar8 = IR::SymOpnd::IsPropertySymOpnd(this_00);
  if (!bVar8) {
    return false;
  }
  this_01 = IR::Opnd::AsPropertySymOpnd((((LabelInstr *)instrStFld)->super_Instr).m_dst);
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if (!bVar8) {
    return false;
  }
  local_58 = (LabelInstr *)typeOpndOut;
  pLVar14 = (LabelInstr *)
            IR::Opnd::AsPropertySymOpnd((((LabelInstr *)instrStFld)->super_Instr).m_dst);
  pOVar4 = *(ObjTypeSpecFldInfo **)&(pLVar14->super_Instr).field_0x38;
  if ((pOVar4 != (ObjTypeSpecFldInfo *)0x0) &&
     (bVar8 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar4), bVar8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cee,
                       "(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto())"
                       ,
                       "!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto()"
                      );
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate((PropertySymOpnd *)pLVar14);
  if ((!bVar8) &&
     (((pLVar14->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.field_0xf & 0x4e) != 0)
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cf0,"(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "Property sym operand optimized despite not being a candidate?");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate((PropertySymOpnd *)pLVar14);
  if (!bVar8) {
    return false;
  }
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqParticipant((PropertySymOpnd *)pLVar14);
  if ((!bVar8) &&
     (bVar8 = IR::PropertySymOpnd::NeedsLocalTypeCheck((PropertySymOpnd *)pLVar14), !bVar8)) {
    return false;
  }
  local_78 = labelHelperOut;
  bVar8 = IR::PropertySymOpnd::NeedsTypeCheckAndBailOut((PropertySymOpnd *)pLVar14);
  if (bVar8) {
    if (((((LabelInstr *)instrStFld)->super_Instr).field_0x38 & 0x10) != 0) {
      BVar11 = IR::Instr::GetBailOutKind(instrStFld);
      bVar8 = IR::IsTypeCheckBailOutKind(BVar11);
      if (bVar8) goto LAB_005d287b;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cfc,
                       "(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())))"
                       ,
                       "!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind()))"
                      );
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
LAB_005d287b:
  bVar8 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate((PropertySymOpnd *)pLVar14);
  if (((bVar8) &&
      (((pLVar14->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
        super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.field_0xf & 8) != 0))
     && ((BVSparse<Memory::JitArenaAllocator> *)(pLVar14->super_Instr).m_src2 !=
         (BVSparse<Memory::JitArenaAllocator> *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d00,
                       "(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr)"
                       ,
                       "!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr"
                      );
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  pLVar7 = local_40;
  pJVar15 = JITTimeWorkItem::GetJITFunctionBody(local_40->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar15);
  this_02 = JITTimeWorkItem::GetJITTimeInfo(pLVar7->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,ObjTypeSpecPhase,sourceContextId,functionId)
  ;
  if (bVar8) {
    pFVar16 = (Func *)Js::OpCodeUtil::GetOpCodeName
                                ((((LabelInstr *)instrStFld)->super_Instr).m_opcode);
    pIVar20 = (pLVar14->super_Instr).m_next;
    if (*(SymKind *)((long)&pIVar20->m_next + 4) != SymKindProperty) {
      AssertCount = AssertCount + 1;
      local_50 = pFVar16;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar8) goto LAB_005d2fbd;
      *puVar13 = 0;
      pFVar16 = local_50;
    }
    uVar2 = *(uint *)&pIVar20->m_prev;
    pJVar15 = JITTimeWorkItem::GetJITFunctionBody(local_40->m_func->m_workItem);
    JITTimeFunctionBody::GetDisplayName(pJVar15);
    Output::Print(L"Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pFVar16,(ulong)uVar2);
    Output::Flush();
  }
  bVar8 = IR::PropertySymOpnd::HasFinalType((PropertySymOpnd *)pLVar14);
  if ((bVar8) &&
     ((pOVar4 = *(ObjTypeSpecFldInfo **)&(pLVar14->super_Instr).field_0x38,
      pOVar4 == (ObjTypeSpecFldInfo *)0x0 ||
      (bVar8 = ObjTypeSpecFldInfo::IsLoadedFromProto(pOVar4), !bVar8)))) {
    IR::PropertySymOpnd::UpdateSlotForFinalType((PropertySymOpnd *)pLVar14);
  }
  local_50 = (((LabelInstr *)instrStFld)->super_Instr).m_func;
  if (((((LabelInstr *)instrStFld)->super_Instr).field_0x38 & 0x10) == 0) {
    bVar8 = false;
  }
  else {
    BVar11 = IR::Instr::GetBailOutKind(instrStFld);
    bVar8 = IR::IsTypeCheckBailOutKind(BVar11);
  }
  bVar1 = (pLVar14->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.field_0xf;
  if ((bVar1 & 8) == 0) {
    bVar10 = IR::PropertySymOpnd::HasFinalType((PropertySymOpnd *)pLVar14);
    if (((bVar10) &&
        (bVar10 = IR::PropertySymOpnd::HasInitialType((PropertySymOpnd *)pLVar14), bVar10)) &&
       (((pLVar14->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.field_0xf & 4) == 0))
    {
      GenerateStFldWithCachedFinalType(local_40,instrStFld,(PropertySymOpnd *)pLVar14);
      return true;
    }
    if (((pLVar14->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.field_0xf & 0x20) !=
        0) {
      return false;
    }
    bVar10 = IR::PropertySymOpnd::NeedsPrimaryTypeCheck((PropertySymOpnd *)pLVar14);
    if ((!bVar10) &&
       (bVar10 = IR::PropertySymOpnd::NeedsLocalTypeCheck((PropertySymOpnd *)pLVar14), !bVar10)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      local_48 = (LabelInstr *)__tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)&(local_48->super_Instr)._vptr_Instr = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                          ,0x1d35,
                          "(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck())"
                          ,
                          "propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck()"
                         );
      if (!bVar10) goto LAB_005d2fbd;
      *(undefined4 *)&(local_48->super_Instr)._vptr_Instr = 0;
    }
    pFVar16 = local_50;
    local_68 = (LabelInstr *)CONCAT71(local_68._1_7_,bVar1);
    local_38 = IR::LabelInstr::New(Label,local_50,true);
    pLVar17 = IR::LabelInstr::New(Label,pFVar16,true);
    local_48 = pLVar17;
    if (bVar8 == false) {
      pLVar17 = IR::LabelInstr::New(Label,local_50,true);
    }
    local_60.t = (Type)GenerateCachedTypeCheck
                                 (local_40,instrStFld,(PropertySymOpnd *)pLVar14,pLVar17,local_48,
                                  local_38);
    (local_58->super_Instr)._vptr_Instr = (_func_int **)local_60.t;
  }
  else {
    local_68 = (LabelInstr *)CONCAT71(local_68._1_7_,bVar1);
    local_48 = (LabelInstr *)0x0;
    local_38 = (LabelInstr *)0x0;
    pLVar17 = (LabelInstr *)0x0;
    local_60.t = (Type)0x0;
  }
  GenerateDirectFieldStore(local_40,instrStFld,(PropertySymOpnd *)pLVar14);
  pFVar16 = local_50;
  if (((ulong)local_68 & 8) == 0) {
    local_68 = pLVar17;
    local_58 = IR::LabelInstr::New(Label,local_50,false);
    local_6c = 0x426;
    pBVar18 = IR::BranchInstr::New(JMP,local_58,pFVar16);
    IR::Instr::InsertBefore(instrStFld,&pBVar18->super_Instr);
    IR::Instr::InsertBefore(instrStFld,&local_38->super_Instr);
    pLVar17 = local_48;
    pOVar4 = *(ObjTypeSpecFldInfo **)&(pLVar14->super_Instr).field_0x38;
    local_38 = pLVar14;
    if (((pOVar4 != (ObjTypeSpecFldInfo *)0x0) &&
        (bVar10 = ObjTypeSpecFldInfo::IsMono(pOVar4), bVar10)) &&
       (bVar10 = IR::PropertySymOpnd::HasInitialType((PropertySymOpnd *)local_38),
       pLVar14 = local_38, bVar10)) {
      GenerateCachedTypeWithoutPropertyCheck
                (local_40,instrStFld,(PropertySymOpnd *)local_38,(Opnd *)local_60.t,pLVar17);
      local_60 = IR::PropertySymOpnd::GetInitialType((PropertySymOpnd *)pLVar14);
      finalType = IR::PropertySymOpnd::GetType((PropertySymOpnd *)pLVar14);
      GenerateFieldStoreWithTypeChange
                (local_40,instrStFld,(PropertySymOpnd *)pLVar14,local_60,finalType);
      pBVar18 = IR::BranchInstr::New((OpCode)local_6c,local_58,local_50);
      IR::Instr::InsertBefore(instrStFld,&pBVar18->super_Instr);
    }
    IR::Instr::InsertBefore(instrStFld,&pLVar17->super_Instr);
    IR::Instr::InsertAfter(instrStFld,&local_58->super_Instr);
    pLVar14 = local_68;
    ppLVar6 = local_78;
    if (bVar8 != false) {
      pBVar19 = IR::Instr::GetBailOutInfo(instrStFld);
      if ((LabelInstr *)pBVar19->bailOutInstr == (LabelInstr *)instrStFld) {
        pBVar19 = IR::Instr::GetBailOutInfo(instrStFld);
        if (pBVar19->polymorphicCacheIndex != *(InlineCacheIndex *)&(local_38->super_Instr).m_func)
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                              ,0x1d80,
                              "(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex)"
                              ,
                              "instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex"
                             );
          if (!bVar10) goto LAB_005d2fbd;
          *puVar13 = 0;
        }
      }
      else {
        IVar3 = *(InlineCacheIndex *)&(local_38->super_Instr).m_func;
        pBVar19 = IR::Instr::GetBailOutInfo(instrStFld);
        pBVar19->polymorphicCacheIndex = IVar3;
      }
      (((LabelInstr *)instrStFld)->super_Instr).m_opcode = BailOut;
      IR::Instr::FreeSrc1(instrStFld);
      IR::Instr::FreeDst(instrStFld);
      GenerateBailOut(local_40,instrStFld,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      return bVar8;
    }
    *continueAsHelperOut = true;
    if (local_68 == (LabelInstr *)0x0 || local_68 == pLVar17) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1d8d,
                         "(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed)"
                         ,
                         "labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed"
                        );
      if (!bVar8) goto LAB_005d2fbd;
      *puVar13 = 0;
    }
    *ppLVar6 = pLVar14;
    return false;
  }
  local_48 = (LabelInstr *)((ulong)local_48 | (ulong)local_38);
  if (local_48 != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d46,
                       "(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr)",
                       "labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr");
    if (!bVar8) goto LAB_005d2fbd;
    *puVar13 = 0;
  }
  if ((((((LabelInstr *)instrStFld)->super_Instr).field_0x38 & 0x10) != 0) &&
     (bVar8 = IR::Instr::OnlyHasLazyBailOut(instrStFld), !bVar8)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d4a,"(!instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut())"
                       ,"Why does a direct field store have bailout that is not lazy?");
    if (!bVar8) {
LAB_005d2fbd:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar13 = 0;
  }
  bVar8 = IR::PropertySymOpnd::HasInitialType((PropertySymOpnd *)pLVar14);
  if ((bVar8) && (bVar8 = IR::PropertySymOpnd::HasFinalType((PropertySymOpnd *)pLVar14), bVar8)) {
    local_80.t = (Type)IR::PropertySymOpnd::GetInitialType((PropertySymOpnd *)pLVar14);
    this_03 = JITTypeHolderBase<void>::operator->(&local_80);
    this_04 = JITType::GetTypeHandler(this_03);
    bVar8 = JITTypeHandler::IsPrototype(this_04);
    pLVar7 = local_40;
    if (bVar8) {
      LoadScriptContext(local_40,instrStFld);
      PVar12 = IR::PropertySymOpnd::GetPropertyId((PropertySymOpnd *)pLVar14);
      opndArg = IR::IntConstOpnd::New((long)PVar12,TyInt32,pLVar7->m_func,true);
      LowererMD::LoadHelperArgument(&pLVar7->m_lowererMD,instrStFld,&opndArg->super_Opnd);
      pIVar20 = IR::Instr::New(Call,pLVar7->m_func);
      IR::Instr::InsertBefore(instrStFld,pIVar20);
      LowererMD::ChangeToHelperCall
                (&pLVar7->m_lowererMD,pIVar20,HelperInvalidateProtoCaches,(LabelInstr *)0x0,
                 (Opnd *)0x0,(PropertySymOpnd *)0x0,false);
    }
  }
  IR::Instr::Remove(instrStFld);
  return true;
}

Assistant:

bool
Lowerer::GenerateStFldWithCachedType(IR::Instr *instrStFld, bool* continueAsHelperOut, IR::LabelInstr** labelHelperOut, IR::RegOpnd** typeOpndOut)
{
    IR::Instr *instr;
    IR::RegOpnd *typeOpnd = nullptr;
    IR::LabelInstr* labelObjCheckFailed  = nullptr;
    IR::LabelInstr *labelTypeCheckFailed = nullptr;
    IR::LabelInstr *labelBothTypeChecksFailed = nullptr;
    IR::LabelInstr *labelDone = nullptr;

    Assert(continueAsHelperOut != nullptr);
    *continueAsHelperOut = false;

    Assert(labelHelperOut != nullptr);
    *labelHelperOut = nullptr;

    Assert(typeOpndOut != nullptr);
    *typeOpndOut = nullptr;

    Assert(instrStFld->GetDst()->IsSymOpnd());
    if (!instrStFld->GetDst()->AsSymOpnd()->IsPropertySymOpnd() || !instrStFld->GetDst()->AsPropertySymOpnd()->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    IR::PropertySymOpnd *propertySymOpnd = instrStFld->GetDst()->AsPropertySymOpnd();

    // If we have any object type spec info, we better not believe this is a load from prototype, since this is a store
    // and we never share inline caches between loads and stores.
    Assert(!propertySymOpnd->HasObjTypeSpecFldInfo() || !propertySymOpnd->IsLoadedFromProto());

    AssertMsg(propertySymOpnd->TypeCheckSeqBitsSetOnlyIfCandidate(), "Property sym operand optimized despite not being a candidate?");

    if (!propertySymOpnd->IsTypeCheckSeqCandidate())
    {
        return false;
    }

    if (!propertySymOpnd->IsTypeCheckSeqParticipant() && !propertySymOpnd->NeedsLocalTypeCheck())
    {
        return false;
    }

    Assert(!propertySymOpnd->NeedsTypeCheckAndBailOut() || (instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind())));

    // In the backwards pass we only add guarded property operations to instructions that are not already
    // protected by an upstream type check.
    Assert(!propertySymOpnd->IsTypeCheckProtected() || propertySymOpnd->GetGuardedPropOps() == nullptr);

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Field store: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrStFld->m_opcode),
        propertySymOpnd->m_sym->AsPropertySym()->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        propertySymOpnd->m_inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(),
        propertySymOpnd->IsTypeChecked() ? _u("true") : _u("false"));

    if (propertySymOpnd->HasFinalType() && !propertySymOpnd->IsLoadedFromProto())
    {
        propertySymOpnd->UpdateSlotForFinalType();
    }

    Func* func = instrStFld->m_func;

    // TODO (ObjTypeSpec): If ((PropertySym*)propertySymOpnd->m_sym)->m_stackSym->m_isIntConst consider emitting a direct
    // jump to helper or bailout.  If we have a type check bailout, we could even abort compilation.

    bool hasTypeCheckBailout = instrStFld->HasBailOutInfo() && IR::IsTypeCheckBailOutKind(instrStFld->GetBailOutKind());

    // If the type hasn't been checked upstream, see if it makes sense to check it here.
    bool isTypeChecked = propertySymOpnd->IsTypeChecked();
    if (!isTypeChecked)
    {
        // If the initial type has been checked, we can do a hard coded type transition without any type checks
        // (see GenerateStFldWithCachedFinalType), which is always worth doing, even if the type is not needed
        // downstream.  We're not introducing any additional bailouts.
        if (propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType() && !propertySymOpnd->IsTypeDead())
        {
            // We have a final type in hand, so we can JIT (most of) the type transition work.
            return this->GenerateStFldWithCachedFinalType(instrStFld, propertySymOpnd);
        }

        if (propertySymOpnd->HasTypeMismatch())
        {
            // So we have a type mismatch, which happens when the type (and the type without property if ObjTypeSpecStore
            // is on) on this instruction didn't match the live type value according to the flow. We must have hit some
            // stale inline cache (perhaps inlined from a different function, or on a code path not taken for a while).
            // Either way, we know exactly what type the object must have at this point (fully determined by flow), but
            // we don't know whether that type already has the property we're storing here. All in all, we know exactly
            // what shape the object will have after this operation, but we're not sure what label (type) to give this
            // shape. Thus we can simply let the fast path do its thing based on the live inline cache. The downstream
            // instructions relying only on this shape (loads and stores) are safe, and those that need the next type
            // (i.e. adds) will do the same thing as this instruction.
            return false;
        }

        // If we're still here then we must need a primary type check on this instruction to protect
        // a sequence of field operations downstream, or a local type check for an isolated field store.
        Assert(propertySymOpnd->NeedsPrimaryTypeCheck() || propertySymOpnd->NeedsLocalTypeCheck());

        labelTypeCheckFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelBothTypeChecksFailed = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        labelObjCheckFailed = hasTypeCheckBailout ? labelBothTypeChecksFailed : IR::LabelInstr::New(Js::OpCode::Label, func, true);
        typeOpnd = this->GenerateCachedTypeCheck(instrStFld, propertySymOpnd, labelObjCheckFailed, labelBothTypeChecksFailed, labelTypeCheckFailed);
        *typeOpndOut = typeOpnd;
    }

    // Either we are protected by a type check upstream or we just emitted a type check above,
    // now it's time to store the field value.
    GenerateDirectFieldStore(instrStFld, propertySymOpnd);

    // If we are protected by a type check upstream, we don't need a bailout or helper here, delete the instruction
    // and return "true" to indicate that we succeeded in eliminating it.
    if (isTypeChecked)
    {
        Assert(labelTypeCheckFailed == nullptr && labelBothTypeChecksFailed == nullptr);
        AssertMsg(
            !instrStFld->HasBailOutInfo() || instrStFld->OnlyHasLazyBailOut(),
            "Why does a direct field store have bailout that is not lazy?"
        );

        if (propertySymOpnd->HasInitialType() && propertySymOpnd->HasFinalType())
        {
            bool isPrototypeTypeHandler = propertySymOpnd->GetInitialType()->GetTypeHandler()->IsPrototype();
            if (isPrototypeTypeHandler)
            {
                LoadScriptContext(instrStFld);
                m_lowererMD.LoadHelperArgument(instrStFld, IR::IntConstOpnd::New(propertySymOpnd->GetPropertyId(), TyInt32, m_func, true));
                IR::Instr * invalidateCallInstr = IR::Instr::New(Js::OpCode::Call, m_func);
                instrStFld->InsertBefore(invalidateCallInstr);
                m_lowererMD.ChangeToHelperCall(invalidateCallInstr, IR::HelperInvalidateProtoCaches);
            }
        }
        instrStFld->Remove();
        return true;
    }

    // Otherwise, branch around the helper on successful type check.
    labelDone = IR::LabelInstr::New(Js::OpCode::Label, func);
    instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
    instrStFld->InsertBefore(instr);

    // On failed type check, try the type without property if we've got one.
    instrStFld->InsertBefore(labelTypeCheckFailed);

    // Caution, this is one of the dusty corners of the JIT.  We only get here if this is an isolated StFld which adds a property, or
    // ObjTypeSpecStore is off.  In the former case no downstream operations depend on the final type produced here, and we can fall
    // back on live cache and helper if the type doesn't match.  In the latter we may have a cache with type transition, which must
    // produce a value for the type after transition, because that type is consumed downstream. Thus, if the object's type doesn't
    // match either the type with or the type without the property we're storing, we must bail out here.
    bool emitAddProperty = propertySymOpnd->IsMono() && propertySymOpnd->HasInitialType();

    if (emitAddProperty)
    {
        GenerateCachedTypeWithoutPropertyCheck(instrStFld, propertySymOpnd, typeOpnd, labelBothTypeChecksFailed);
        GenerateFieldStoreWithTypeChange(instrStFld, propertySymOpnd, propertySymOpnd->GetInitialType(), propertySymOpnd->GetType());
        instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, func);
        instrStFld->InsertBefore(instr);
    }

    instrStFld->InsertBefore(labelBothTypeChecksFailed);
    instrStFld->InsertAfter(labelDone);

    if (hasTypeCheckBailout)
    {
        if (instrStFld->GetBailOutInfo()->bailOutInstr != instrStFld)
        {
            // Set the cache index in the bailout info so that the generated code will write it into the
            // bailout record at runtime.
            instrStFld->GetBailOutInfo()->polymorphicCacheIndex = propertySymOpnd->m_inlineCacheIndex;
        }
        else
        {
            Assert(instrStFld->GetBailOutInfo()->polymorphicCacheIndex == propertySymOpnd->m_inlineCacheIndex);
        }

        instrStFld->m_opcode = Js::OpCode::BailOut;
        instrStFld->FreeSrc1();
        instrStFld->FreeDst();

        this->GenerateBailOut(instrStFld);
        return true;
    }
    else
    {
        *continueAsHelperOut = true;
        Assert(labelObjCheckFailed != nullptr && labelObjCheckFailed != labelBothTypeChecksFailed);
        *labelHelperOut = labelObjCheckFailed;
        return false;
    }
}